

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

SpanReader * __thiscall
SpanReader::operator>>
          (SpanReader *this,
          Wrapper<(anonymous_namespace)::DepGraphFormatter,_cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>_&>
          *obj)

{
  iterator __position;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *pDVar1;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *pDVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  ClusterIndex child;
  unsigned_long uVar6;
  ulong uVar7;
  long lVar8;
  iterator __begin4;
  pointer puVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  Span<const_unsigned_int> mapping;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reordering;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> topo_depgraph;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> local_78;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  while( true ) {
    uVar5 = ReadVarInt<SpanReader,(VarIntMode)1,int>(this);
    if (((uVar5 & 0x3fffff) == 0) ||
       ((long)local_78.entries.
              super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_78.entries.
              super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x300)) break;
    uVar6 = ReadVarInt<SpanReader,(VarIntMode)0,unsigned_long>(this);
    local_58.entries.
    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(-(ulong)((uint)uVar6 & 1) ^ uVar6 >> 1 & 0x7ffffffffffff);
    local_58.entries.
    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(CONCAT44(local_58.entries.
                            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_,uVar5) &
                  0xffffffff003fffff);
    child = cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::AddTransaction
                      (&local_78,(FeeFrac *)&local_58);
    uVar5 = (uint)((ulong)((long)local_98.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_98.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
    local_58.entries.
    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.entries.
                           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar5);
    if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_98,
                 (iterator)
                 local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_58);
    }
    else {
      *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar5;
      local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar7 = ReadVarInt<SpanReader,(VarIntMode)0,unsigned_long>(this);
    if (child != 0) {
      uVar10 = (ulong)child;
      do {
        if ((local_78.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar10 - 1 & 0xffffffff].descendants.m_val &
            1 << ((byte)child & 0x1f)) == 0) {
          if (uVar7 == 0) {
            cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::AddDependency
                      (&local_78,(ClusterIndex)(uVar10 - 1),child);
            uVar7 = ReadVarInt<SpanReader,(VarIntMode)0,unsigned_long>(this);
          }
          else {
            uVar7 = uVar7 - 1;
          }
        }
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    __position._M_current =
         local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    lVar8 = (long)__position._M_current -
            (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = lVar8 + 1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar7;
    if (__position._M_current !=
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      puVar9 = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        *puVar9 = (*puVar9 + 1) -
                  (uint)((ulong)*puVar9 < lVar8 - (SUB168(auVar4 % auVar3,0) & 0xffffffff));
        puVar9 = puVar9 + 1;
      } while (puVar9 != __position._M_current);
    }
    uVar5 = (int)lVar8 - SUB164(auVar4 % auVar3,0);
    local_58.entries.
    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.entries.
                           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar5);
    if (__position._M_current ==
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_98,__position,(uint *)&local_58);
    }
    else {
      local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] = uVar5;
    }
  }
  mapping.m_size =
       (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  mapping.m_data =
       local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph
            (&local_58,&local_78,mapping);
  pDVar1 = obj->m_object;
  pDVar2 = obj[2].m_object;
  obj->m_object =
       (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
       local_58.entries.
       super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  obj[1].m_object =
       (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
       local_58.entries.
       super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  obj[2].m_object =
       (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
       local_58.entries.
       super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pDVar1 != (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)0x0) {
    operator_delete(pDVar1,(long)pDVar2 - (long)pDVar1);
    if (local_58.entries.
        super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.entries.
                      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.entries.
                            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.entries.
                            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.entries.
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.entries.
                          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.entries.
                          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

SpanReader& operator>>(T&& obj)
    {
        ::Unserialize(*this, obj);
        return (*this);
    }